

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_nearest_compute_blob.h
# Opt level: O0

void ncnn::gridsample_3d_nearest_compute_blob<(ncnn::GridSample::PaddingMode)3,false>
               (Mat *src,Mat *grid,Mat *offset_value,int permute_fusion)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int in_ECX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  float fVar7;
  float fVar8;
  float fVar9;
  int *iptr_1;
  bool in_bound_1;
  int z0_1;
  int y0_1;
  int x0_1;
  float sample_z_1;
  float sample_y_1;
  float sample_x_1;
  int x_1;
  float *gridptr_z;
  float *gridptr_y;
  float *gridptr_x;
  int *iptr;
  bool in_bound;
  int z0;
  int y0;
  int x0;
  float sample_z;
  float sample_y;
  float sample_x;
  int x;
  float *gridptr;
  int y;
  compute_coord<(ncnn::GridSample::PaddingMode)3,_false> get_coord;
  grid_sample_unormalize<false> unormalize;
  float *offset_ptr;
  int grid_size;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  double local_628;
  undefined8 in_stack_fffffffffffff9e8;
  undefined8 *puVar10;
  compute_coord<(ncnn::GridSample::PaddingMode)3,_false> *in_stack_fffffffffffff9f0;
  double local_5a8;
  int local_52c;
  undefined8 local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined4 local_510;
  long local_508;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  undefined8 local_4e8;
  float *local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined4 local_4c0;
  long local_4b8;
  undefined4 local_4b0;
  undefined4 local_4ac;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined8 local_498;
  float *local_490;
  undefined8 local_488;
  undefined8 local_480;
  undefined8 local_478;
  undefined4 local_470;
  long local_468;
  undefined4 local_460;
  undefined4 local_45c;
  undefined4 local_458;
  undefined4 local_454;
  undefined4 local_450;
  undefined8 local_448;
  float *local_440;
  int *local_438;
  undefined1 local_42d;
  uint local_42c;
  uint local_428;
  uint local_424;
  float local_420;
  float local_41c;
  float local_418;
  int local_414;
  undefined8 local_410;
  undefined8 local_408;
  undefined8 local_400;
  undefined4 local_3f8;
  long local_3f0;
  undefined4 local_3e8;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined8 local_3d0;
  float *local_3c8;
  int local_3c0;
  grid_sample_unormalize<false> local_3b9;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined8 local_3a8;
  undefined4 local_3a0;
  long local_398;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined8 local_378;
  int *local_370;
  int local_368;
  long *local_358;
  long local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  undefined8 *local_338;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_318;
  undefined8 *local_308;
  undefined8 *local_2f8;
  undefined8 *local_2e8;
  undefined8 *local_2d8;
  undefined1 local_2a5;
  undefined4 local_2a4;
  undefined8 *local_298;
  undefined1 local_26d;
  undefined4 local_26c;
  undefined8 *local_260;
  undefined1 local_235;
  undefined4 local_234;
  undefined8 *local_228;
  undefined1 local_1fd;
  int local_1fc;
  undefined8 *local_1f0;
  undefined8 *local_1c8;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  undefined1 local_1a5;
  undefined4 local_1a4;
  undefined8 *local_198;
  undefined8 *local_170;
  long local_168;
  undefined4 local_15c;
  long local_158;
  int *local_150;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined8 *local_138;
  long local_130;
  undefined4 local_124;
  long local_120;
  float *local_118;
  undefined4 local_10c;
  int local_108;
  int local_104;
  undefined8 *local_100;
  long local_f8;
  undefined4 local_ec;
  long local_e8;
  float *local_e0;
  undefined4 local_d4;
  int local_d0;
  int local_cc;
  undefined8 *local_c8;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  float *local_a8;
  undefined4 local_9c;
  int local_98;
  int local_94;
  undefined8 *local_90;
  long local_88;
  undefined4 local_7c;
  long local_78;
  float *local_70;
  undefined4 local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_368 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34);
  local_198 = &local_3b8;
  local_13c = *(int *)((long)in_RDX + 0x2c);
  local_140 = (int)in_RDX[6];
  local_144 = *(undefined4 *)((long)in_RDX + 0x34);
  local_370 = (int *)*in_RDX;
  local_158 = in_RDX[2];
  local_15c = (undefined4)in_RDX[3];
  local_168 = in_RDX[4];
  local_138 = &local_3b8;
  local_8 = (long)local_13c * (long)local_140 * local_158;
  local_170 = &local_3b8;
  local_348 = &local_3b8;
  local_c = 0x10;
  local_1a4 = 0;
  local_1a5 = 1;
  local_3b8 = 0;
  local_3a8 = 0;
  local_3a0 = 0;
  local_390 = 0;
  local_38c = 0;
  local_388 = 0;
  local_384 = 0;
  local_380 = 0;
  local_378 = 0;
  local_3b0 = 0;
  local_350 = in_RDI;
  local_2d8 = local_348;
  local_150 = local_370;
  local_398 = local_168;
  if (in_ECX == 0) {
    local_358 = in_RSI;
    for (local_3c0 = 0; local_3c0 < (int)local_358[7]; local_3c0 = local_3c0 + 1) {
      local_1f0 = &local_410;
      local_104 = *(int *)((long)local_358 + 0x2c);
      local_108 = (int)local_358[6];
      local_10c = *(undefined4 *)((long)local_358 + 0x34);
      local_3c8 = (float *)(*local_358 + local_358[8] * (long)local_3c0 * local_358[2]);
      local_120 = local_358[2];
      local_124 = (undefined4)local_358[3];
      local_130 = local_358[4];
      local_100 = &local_410;
      local_18 = (long)local_104 * (long)local_108 * local_120;
      local_1b0 = &local_410;
      local_340 = &local_410;
      local_1c = 0x10;
      local_1fc = local_3c0;
      local_1fd = 1;
      local_410 = 0;
      local_400 = 0;
      local_3f8 = 0;
      local_3e8 = 0;
      local_3e4 = 0;
      local_3e0 = 0;
      local_3dc = 0;
      local_3d8 = 0;
      local_3d0 = 0;
      local_408 = 0;
      local_2e8 = local_340;
      local_118 = local_3c8;
      local_3f0 = local_130;
      for (local_414 = 0; local_414 < local_368; local_414 = local_414 + 3) {
        local_418 = *local_3c8;
        local_41c = local_3c8[1];
        local_420 = local_3c8[2];
        local_418 = grid_sample_unormalize<false>::operator()
                              (&local_3b9,*(int *)(local_350 + 0x2c),local_418);
        local_418 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                              (in_stack_fffffffffffff9f0,
                               (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                               (float)in_stack_fffffffffffff9e8);
        local_41c = grid_sample_unormalize<false>::operator()
                              (&local_3b9,*(int *)(local_350 + 0x30),local_41c);
        local_41c = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                              (in_stack_fffffffffffff9f0,
                               (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                               (float)in_stack_fffffffffffff9e8);
        local_420 = grid_sample_unormalize<false>::operator()
                              (&local_3b9,*(int *)(local_350 + 0x34),local_420);
        local_420 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                              (in_stack_fffffffffffff9f0,
                               (int)((ulong)in_stack_fffffffffffff9e8 >> 0x20),
                               (float)in_stack_fffffffffffff9e8);
        fVar7 = floorf(local_418 + 0.5);
        local_424 = (uint)fVar7;
        fVar7 = floorf(local_41c + 0.5);
        local_428 = (uint)fVar7;
        fVar7 = floorf(local_420 + 0.5);
        local_42c = (uint)fVar7;
        bVar1 = (int)local_424 < *(int *)(local_350 + 0x2c);
        bVar2 = (int)local_428 < *(int *)(local_350 + 0x30);
        bVar3 = (int)local_42c < *(int *)(local_350 + 0x34);
        local_42d = ((((local_424 < 0x80000000 && bVar1) && local_428 < 0x80000000) && bVar2) &&
                    local_42c < 0x80000000) && bVar3;
        local_438 = local_370;
        if (((((local_424 < 0x80000000 && bVar1) && local_428 < 0x80000000) && bVar2) &&
            local_42c < 0x80000000) && bVar3) {
          local_5a8 = (double)(int)((local_424 + local_428 * *(int *)(local_350 + 0x2c) +
                                    local_42c * *(int *)(local_350 + 0x2c) *
                                    *(int *)(local_350 + 0x30)) * *(int *)(local_350 + 0x18));
        }
        else {
          local_5a8 = -1.0;
        }
        *local_370 = (int)local_5a8;
        local_3c8 = local_3c8 + 3;
        local_370 = local_370 + 1;
      }
    }
  }
  else {
    local_228 = &local_488;
    local_cc = *(int *)((long)in_RSI + 0x2c);
    local_d0 = (int)in_RSI[6];
    local_d4 = *(undefined4 *)((long)in_RSI + 0x34);
    local_440 = (float *)*in_RSI;
    local_e8 = in_RSI[2];
    local_ec = (undefined4)in_RSI[3];
    local_f8 = in_RSI[4];
    local_c8 = &local_488;
    local_28 = (long)local_cc * (long)local_d0 * local_e8;
    local_1b8 = &local_488;
    local_338 = &local_488;
    local_260 = &local_4d8;
    local_94 = *(int *)((long)in_RSI + 0x2c);
    local_98 = (int)in_RSI[6];
    local_9c = *(undefined4 *)((long)in_RSI + 0x34);
    local_490 = (float *)(*in_RSI + in_RSI[8] * in_RSI[2]);
    local_b0 = in_RSI[2];
    local_b4 = (undefined4)in_RSI[3];
    local_c0 = in_RSI[4];
    local_90 = &local_4d8;
    local_38 = (long)local_94 * (long)local_98 * local_b0;
    local_1c0 = &local_4d8;
    local_330 = &local_4d8;
    local_298 = &local_528;
    local_5c = *(int *)((long)in_RSI + 0x2c);
    local_60 = (int)in_RSI[6];
    local_64 = *(undefined4 *)((long)in_RSI + 0x34);
    local_4e0 = (float *)(*in_RSI + in_RSI[8] * 2 * in_RSI[2]);
    local_78 = in_RSI[2];
    local_7c = (undefined4)in_RSI[3];
    local_88 = in_RSI[4];
    local_58 = &local_528;
    local_48 = (long)local_5c * (long)local_60 * local_78;
    local_1c8 = &local_528;
    puVar10 = &local_528;
    local_380 = 0;
    local_384 = 0;
    local_388 = 0;
    local_38c = 0;
    local_3a0 = 0;
    local_3a8 = 0;
    local_3b0 = 0;
    local_3b8 = 0;
    local_450 = 0;
    local_454 = 0;
    local_458 = 0;
    local_45c = 0;
    local_470 = 0;
    local_478 = 0;
    local_480 = 0;
    local_488 = 0;
    local_4a0 = 0;
    local_4a4 = 0;
    local_4a8 = 0;
    local_4ac = 0;
    local_4c0 = 0;
    local_4c8 = 0;
    local_4d0 = 0;
    local_4d8 = 0;
    local_c = 0x10;
    local_2c = 0x10;
    local_3c = 0x10;
    local_4c = 0x10;
    local_1a4 = 0;
    local_1a5 = 1;
    local_234 = 0;
    local_235 = 1;
    local_26c = 1;
    local_26d = 1;
    local_2a4 = 2;
    local_2a5 = 1;
    local_378 = 0;
    local_390 = 0;
    local_448 = 0;
    local_460 = 0;
    local_498 = 0;
    local_4b0 = 0;
    local_528 = 0;
    local_518 = 0;
    local_510 = 0;
    local_500 = 0;
    local_4fc = 0;
    local_4f8 = 0;
    local_4f4 = 0;
    local_4f0 = 0;
    local_4e8 = 0;
    local_520 = 0;
    local_328 = puVar10;
    local_318 = puVar10;
    local_308 = local_330;
    local_2f8 = local_338;
    local_e0 = local_440;
    local_a8 = local_490;
    local_70 = local_4e0;
    local_508 = local_88;
    local_4b8 = local_c0;
    local_468 = local_f8;
    for (local_52c = 0; local_52c < local_368; local_52c = local_52c + 1) {
      fVar7 = *local_490;
      fVar9 = *local_4e0;
      grid_sample_unormalize<false>::operator()(&local_3b9,*(int *)(local_350 + 0x2c),*local_440);
      fVar8 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                        (in_stack_fffffffffffff9f0,(int)((ulong)puVar10 >> 0x20),SUB84(puVar10,0));
      grid_sample_unormalize<false>::operator()(&local_3b9,*(int *)(local_350 + 0x30),fVar7);
      fVar7 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                        (in_stack_fffffffffffff9f0,(int)((ulong)puVar10 >> 0x20),SUB84(puVar10,0));
      grid_sample_unormalize<false>::operator()(&local_3b9,*(int *)(local_350 + 0x34),fVar9);
      fVar9 = compute_coord<(ncnn::GridSample::PaddingMode)3,_false>::operator()
                        (in_stack_fffffffffffff9f0,(int)((ulong)puVar10 >> 0x20),SUB84(puVar10,0));
      fVar8 = floorf(fVar8 + 0.5);
      uVar4 = (uint)fVar8;
      fVar7 = floorf(fVar7 + 0.5);
      uVar5 = (uint)fVar7;
      fVar7 = floorf(fVar9 + 0.5);
      uVar6 = (uint)fVar7;
      if (((((uVar4 < 0x80000000 && (int)uVar4 < *(int *)(local_350 + 0x2c)) && uVar5 < 0x80000000)
           && (int)uVar5 < *(int *)(local_350 + 0x30)) && uVar6 < 0x80000000) &&
          (int)uVar6 < *(int *)(local_350 + 0x34)) {
        local_628 = (double)(int)((uVar4 + uVar5 * *(int *)(local_350 + 0x2c) +
                                  uVar6 * *(int *)(local_350 + 0x2c) * *(int *)(local_350 + 0x30)) *
                                 *(int *)(local_350 + 0x18));
      }
      else {
        local_628 = -1.0;
      }
      *local_370 = (int)local_628;
      local_440 = local_440 + 1;
      local_490 = local_490 + 1;
      local_4e0 = local_4e0 + 1;
      local_370 = local_370 + 1;
    }
  }
  return;
}

Assistant:

void gridsample_3d_nearest_compute_blob(const Mat& src, const Mat& grid, Mat& offset_value, int permute_fusion)
{
    const int grid_size = grid.w * grid.h * grid.d;

    float* offset_ptr = offset_value.channel(0);

    grid_sample_unormalize<align_corner> unormalize;
    compute_coord<pd, align_corner> get_coord;

    if (permute_fusion == 0)
    {
        for (int y = 0; y < grid.c; y++)
        {
            const float* gridptr = grid.channel(y);
            int x = 0;
#if __AVX__
            for (; x + 23 < grid_size; x += 24)
            {
                __m256 gx = _mm256_loadu_ps(gridptr);
                __m256 gy = _mm256_loadu_ps(gridptr + 8);
                __m256 gz = _mm256_loadu_ps(gridptr + 16);

                transpose3x8_ps(gx, gy, gz);

                gx = unormalize(_mm256_set1_ps(src.w), gx);
                gx = get_coord(_mm256_set1_ps(src.w), gx);

                gy = unormalize(_mm256_set1_ps(src.h), gy);
                gy = get_coord(_mm256_set1_ps(src.h), gy);

                gz = unormalize(_mm256_set1_ps(src.d), gz);
                gz = get_coord(_mm256_set1_ps(src.d), gz);

                gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
                gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));
                gz = _mm256_floor_ps(_mm256_add_ps(gz, _mm256_set1_ps(0.5f)));

                __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                                  _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));
                v_in_range = _mm256_and_ps(v_in_range, _mm256_and_ps(_mm256_cmp_ps(gz, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), gz, _CMP_GT_OS)));

                __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), gz,
                                              _mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx)),
                                              _mm256_set1_ps(src.elempack));

                offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

                _mm256_storeu_ps(offset_ptr, offset);

                gridptr += 24;
                offset_ptr += 8;
            }

#endif // __AVX__

            for (; x < grid_size; x += 3)
            {
                float sample_x = *gridptr;
                float sample_y = *(gridptr + 1);
                float sample_z = *(gridptr + 2);

                sample_x = unormalize(src.w, sample_x);
                sample_x = get_coord(src.w, sample_x);

                sample_y = unormalize(src.h, sample_y);
                sample_y = get_coord(src.h, sample_y);

                sample_z = unormalize(src.d, sample_z);
                sample_z = get_coord(src.d, sample_z);

                int x0 = static_cast<int>(floorf(sample_x + 0.5f));
                int y0 = static_cast<int>(floorf(sample_y + 0.5f));
                int z0 = static_cast<int>(floorf(sample_z + 0.5f));

                bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h) & (z0 > -1) & (z0 < src.d));

                int* iptr = (int*)offset_ptr;
                *iptr = in_bound ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

                gridptr += 3;
                offset_ptr++;
            }
        }
    }
    else
    {
        const float* gridptr_x = grid.channel(0);
        const float* gridptr_y = grid.channel(1);
        const float* gridptr_z = grid.channel(2);

        int x = 0;
#if __AVX__
        for (; x + 7 < grid_size; x += 8)
        {
            __m256 gx = _mm256_loadu_ps(gridptr_x);
            __m256 gy = _mm256_loadu_ps(gridptr_y);
            __m256 gz = _mm256_loadu_ps(gridptr_z);

            gx = unormalize(_mm256_set1_ps(src.w), gx);
            gx = get_coord(_mm256_set1_ps(src.w), gx);

            gy = unormalize(_mm256_set1_ps(src.h), gy);
            gy = get_coord(_mm256_set1_ps(src.h), gy);

            gz = unormalize(_mm256_set1_ps(src.d), gz);
            gz = get_coord(_mm256_set1_ps(src.d), gz);

            gx = _mm256_floor_ps(_mm256_add_ps(gx, _mm256_set1_ps(0.5f)));
            gy = _mm256_floor_ps(_mm256_add_ps(gy, _mm256_set1_ps(0.5f)));
            gz = _mm256_floor_ps(_mm256_add_ps(gz, _mm256_set1_ps(0.5f)));

            __m256 v_in_range = _mm256_and_ps(_mm256_and_ps(_mm256_cmp_ps(gx, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.w), gx, _CMP_GT_OS)),
                                              _mm256_and_ps(_mm256_cmp_ps(gy, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.h), gy, _CMP_GT_OS)));
            v_in_range = _mm256_and_ps(v_in_range, _mm256_and_ps(_mm256_cmp_ps(gz, _mm256_set1_ps(-1), _CMP_GT_OS), _mm256_cmp_ps(_mm256_set1_ps(src.d), gz, _CMP_GT_OS)));

            __m256 offset = _mm256_mul_ps(_mm256_comp_fmadd_ps(_mm256_mul_ps(_mm256_set1_ps(src.w), _mm256_set1_ps(src.h)), gz,
                                          _mm256_comp_fmadd_ps(gy, _mm256_set1_ps(src.w), gx)),
                                          _mm256_set1_ps(src.elempack));

            offset = _mm256_blendv_ps(_mm256_set1_ps(-1.0f), _mm256_castsi256_ps(_mm256_cvtps_epi32(offset)), v_in_range);

            _mm256_storeu_ps(offset_ptr, offset);

            gridptr_x += 8;
            gridptr_y += 8;
            gridptr_z += 8;

            offset_ptr += 8;
        }

#endif // __AVX__

        for (; x < grid_size; x++)
        {
            float sample_x = *gridptr_x;
            float sample_y = *gridptr_y;
            float sample_z = *gridptr_z;

            sample_x = unormalize(src.w, sample_x);
            sample_x = get_coord(src.w, sample_x);

            sample_y = unormalize(src.h, sample_y);
            sample_y = get_coord(src.h, sample_y);

            sample_z = unormalize(src.d, sample_z);
            sample_z = get_coord(src.d, sample_z);

            int x0 = static_cast<int>(floorf(sample_x + 0.5f));
            int y0 = static_cast<int>(floorf(sample_y + 0.5f));
            int z0 = static_cast<int>(floorf(sample_z + 0.5f));

            bool in_bound = ((x0 > -1) & (x0 < src.w) & (y0 > -1) & (y0 < src.h) & (z0 > -1) & (z0 < src.d));

            int* iptr = (int*)offset_ptr;
            *iptr = in_bound ? (x0 + y0 * src.w + z0 * src.w * src.h) * src.elempack : -1.0;

            gridptr_x++;
            gridptr_y++;
            gridptr_z++;

            offset_ptr++;
        }
    }
}